

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileMtlImporter::getIlluminationModel(ObjFileMtlImporter *this,int *illum_model)

{
  int iVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  int *illum_model_local;
  ObjFileMtlImporter *this_local;
  
  _Var2 = CopyNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,this->m_buffer,0x800
                    );
  (this->m_DataIt)._M_current = _Var2._M_current;
  iVar1 = atoi(this->m_buffer);
  *illum_model = iVar1;
  return;
}

Assistant:

void ObjFileMtlImporter::getIlluminationModel( int &illum_model )
{
    m_DataIt = CopyNextWord<DataArrayIt>( m_DataIt, m_DataItEnd, m_buffer, BUFFERSIZE );
    illum_model = atoi(m_buffer);
}